

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O2

void __thiscall pawn_table::pawn_table(pawn_table *this,pawn_table *o)

{
  size_t sVar1;
  pawn_entry *__p;
  __shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->sz_mb = 0;
  this->count = 0;
  __p = (pawn_entry *)operator_new__(0);
  std::__shared_ptr<pawn_entry[],(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pawn_entry,void>
            ((__shared_ptr<pawn_entry[],(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>,&local_20
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  memcpy((this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (o->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         this->count * 0x128);
  sVar1 = o->count;
  this->sz_mb = o->sz_mb;
  this->count = sVar1;
  return;
}

Assistant:

pawn_table::pawn_table(const pawn_table& o) {
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(pawn_entry));
	sz_mb = o.sz_mb;
	count = o.count;
}